

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

Statement *
slang::ast::RandCaseStatement::fromSyntax
          (Compilation *compilation,RandCaseStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  size_t sVar1;
  pointer ppRVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RandCaseStatement *stmt;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *src;
  bool bVar7;
  long lVar8;
  SmallVector<slang::ast::RandCaseStatement::Item,_8UL> items;
  span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> local_100;
  RandCaseStatementSyntax *local_f0;
  Compilation *local_e8;
  StatementContext *local_e0;
  SourceRange local_d8;
  SmallVectorBase<slang::ast::RandCaseStatement::Item> local_c8 [3];
  
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 8;
  sVar1 = (syntax->items).super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  local_e0 = stmtCtx;
  if (sVar1 == 0) {
    bVar7 = false;
    src = context;
  }
  else {
    ppRVar2 = (syntax->items).
              super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar8 = 0;
    bVar7 = false;
    local_f0 = syntax;
    local_e8 = compilation;
    do {
      lVar3 = *(long *)((long)ppRVar2 + lVar8);
      iVar5 = Expression::bind((int)*(undefined8 *)(lVar3 + 0x18),(sockaddr *)context,0);
      iVar6 = Statement::bind((int)*(undefined8 *)(lVar3 + 0x30),(sockaddr *)context,
                              (socklen_t)local_e0);
      local_100._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
      local_100._M_extent._M_extent_value = (size_t)CONCAT44(extraout_var_00,iVar6);
      SmallVectorBase<slang::ast::RandCaseStatement::Item>::
      emplace_back<slang::ast::RandCaseStatement::Item>(local_c8,(Item *)&local_100);
      src = extraout_RDX;
      if ((*(int *)CONCAT44(extraout_var_00,iVar6) == 0) ||
         (bVar4 = ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var,iVar5)),
         src = extraout_RDX_00, !bVar4)) {
        bVar7 = true;
      }
      lVar8 = lVar8 + 8;
      syntax = local_f0;
      compilation = local_e8;
    } while (sVar1 << 3 != lVar8);
  }
  iVar5 = SmallVectorBase<slang::ast::RandCaseStatement::Item>::copy
                    (local_c8,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
  local_100._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar5);
  local_d8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::RandCaseStatement,std::span<slang::ast::RandCaseStatement::Item,18446744073709551615ul>,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_100,&local_d8);
  if (bVar7) {
    stmt = (RandCaseStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
  if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
    operator_delete(local_c8[0].data_);
  }
  return &stmt->super_Statement;
}

Assistant:

Statement& RandCaseStatement::fromSyntax(Compilation& compilation,
                                         const RandCaseStatementSyntax& syntax,
                                         const ASTContext& context, StatementContext& stmtCtx) {
    bool bad = false;
    SmallVector<Item, 8> items;
    for (auto item : syntax.items) {
        auto& expr = Expression::bind(*item->expr, context);
        auto& stmt = Statement::bind(*item->statement, context, stmtCtx);
        items.push_back({&expr, &stmt});

        if (stmt.bad() || !context.requireIntegral(expr)) {
            bad = true;
        }
    }

    auto result = compilation.emplace<RandCaseStatement>(items.copy(compilation),
                                                         syntax.sourceRange());
    if (bad)
        return badStmt(compilation, result);

    return *result;
}